

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult *
Catch::clara::detail::convertInto(ParserResult *__return_storage_ptr__,string *source,bool *target)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  bool bVar5;
  long lVar6;
  string srcLC;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90 = local_80;
  pcVar1 = (source->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + source->_M_string_length);
  plVar3 = local_90;
  if (local_88 != 0) {
    lVar6 = 0;
    do {
      iVar2 = tolower((uint)*(byte *)((long)plVar3 + lVar6));
      *(char *)((long)plVar3 + lVar6) = (char)iVar2;
      lVar6 = lVar6 + 1;
    } while (local_88 != lVar6);
  }
  iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
  bVar5 = true;
  if (iVar2 != 0) {
    iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
    if (iVar2 != 0) {
      iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
      if (iVar2 != 0) {
        iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
        if (iVar2 != 0) {
          iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
          if (iVar2 != 0) {
            iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
            if (iVar2 != 0) {
              iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
              if (iVar2 != 0) {
                iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
                if (iVar2 != 0) {
                  iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
                  if (iVar2 != 0) {
                    iVar2 = ::std::__cxx11::string::compare((char *)&local_90);
                    if (iVar2 != 0) {
                      ::std::operator+(&local_50,
                                       "Expected a boolean value but did not recognise: \'",source);
                      plVar3 = (long *)::std::__cxx11::string::append((char *)&local_50);
                      psVar4 = (size_type *)(plVar3 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar3 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar4) {
                        local_70.field_2._M_allocated_capacity = *psVar4;
                        local_70.field_2._8_8_ = plVar3[3];
                        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                      }
                      else {
                        local_70.field_2._M_allocated_capacity = *psVar4;
                        local_70._M_dataplus._M_p = (pointer)*plVar3;
                      }
                      local_70._M_string_length = plVar3[1];
                      *plVar3 = (long)psVar4;
                      plVar3[1] = 0;
                      *(undefined1 *)(plVar3 + 2) = 0;
                      BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
                                (__return_storage_ptr__,RuntimeError,&local_70);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                        operator_delete(local_70._M_dataplus._M_p,
                                        local_70.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        local_50.field_2._M_allocated_capacity + 1);
                      }
                      goto LAB_00146856;
                    }
                  }
                }
              }
            }
            bVar5 = false;
          }
        }
      }
    }
  }
  *target = bVar5;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a7158;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_00146856:
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto convertInto( std::string const &source, bool &target ) -> ParserResult {
        std::string srcLC = source;
        std::transform( srcLC.begin(), srcLC.end(), srcLC.begin(), []( unsigned char c ) { return static_cast<char>( std::tolower(c) ); } );
        if (srcLC == "y" || srcLC == "1" || srcLC == "true" || srcLC == "yes" || srcLC == "on")
            target = true;
        else if (srcLC == "n" || srcLC == "0" || srcLC == "false" || srcLC == "no" || srcLC == "off")
            target = false;
        else
            return ParserResult::runtimeError( "Expected a boolean value but did not recognise: '" + source + "'" );
        return ParserResult::ok( ParseResultType::Matched );
    }